

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fapi.c
# Opt level: O2

void ga_iscal_patch_(Integer *g_a,Integer *ilo,Integer *ihi,Integer *jlo,Integer *jhi,Integer *alpha
                    )

{
  Integer atype;
  Integer IStack_38;
  
  pnga_inquire_type(*g_a,&IStack_38);
  pnga_error(" wrong types ",0);
  sga_scale_patch(*g_a,ilo,ihi,jlo,jhi,alpha);
  return;
}

Assistant:

void FATR ga_iscal_patch_(Integer *g_a, Integer *ilo, Integer *ihi, Integer *jlo, Integer *jhi, Integer *alpha)
{
    Integer atype;

    pnga_inquire_type(*g_a, &atype);
    if (atype != C_INT || atype != C_LONG || atype != C_LONGLONG)
        pnga_error(" wrong types ", 0L);
    sga_scale_patch(*g_a, ilo, ihi, jlo, jhi, alpha);
}